

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers_test.cpp
# Opt level: O1

void flatbuffers::tests::FlexBuffersDeprecatedTest(void)

{
  bool expval;
  ulong *puVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  TypedVector vec;
  string test_data;
  Builder slb;
  Verifier local_138;
  long *local_f8;
  size_t local_f0;
  long local_e8 [2];
  String local_d8;
  Reference local_c0;
  Builder local_b0;
  
  flexbuffers::Builder::Builder(&local_b0,0x100,BUILDER_FLAG_SHARE_KEYS);
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,',');
  lVar4 = (long)local_b0.stack_.
                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b0.stack_.
                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                ._M_impl.super__Vector_impl_data._M_start;
  flexbuffers::Builder::String(&local_b0,(char *)local_f8,local_f0);
  flexbuffers::Builder::String(&local_b0,"hello",5);
  flexbuffers::Builder::EndVector(&local_b0,lVar4 >> 4,true,false);
  flexbuffers::Builder::Finish(&local_b0);
  if (local_b0.finished_ != false) {
    local_138.size_ =
         (long)local_b0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_b0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_138.buf_ =
         local_b0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_138.depth_ = 0;
    local_138.max_depth_ = 0x40;
    local_138.num_vectors_ = 0;
    local_138.check_alignment_ = true;
    local_138.reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
    local_138.max_vectors_ = local_138.size_;
    if ((int)local_138.size_ == 0x7fffffff) {
      __assert_fail("static_cast<int32_t>(size_) < FLATBUFFERS_MAX_BUFFER_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                    ,0x6c0,
                    "flexbuffers::Verifier::Verifier(const uint8_t *, size_t, std::vector<uint8_t> *, bool, size_t)"
                   );
    }
    expval = flexbuffers::Verifier::VerifyBuffer(&local_138);
    TestEq<bool,bool>(expval,true,
                      "\'flexbuffers::VerifyBuffer(slb.GetBuffer().data(), slb.GetBuffer().size(), nullptr)\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                      ,0xe8,"");
    if (local_b0.finished_ != false) {
      local_d8.super_Sized.super_Object.data_ =
           local_b0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish +
           (-2 - (ulong)local_b0.buf_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1]);
      local_d8.super_Sized.super_Object._8_8_ =
           (1L << (local_b0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-2] & 3)) << 8 |
           (ulong)(local_b0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-2] >> 2) << 0x20 |
           (ulong)local_b0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1];
      flexbuffers::Reference::AsTypedVector((TypedVector *)&local_138,(Reference *)&local_d8);
      pcVar5 = "";
      TestEq<flexbuffers::Type,flexbuffers::Type>
                ((Type)local_138.max_depth_,FBT_KEY,
                 "\'vec.ElementType()\' != \'flexbuffers::FBT_KEY\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                 ,0xf3,"");
      if (local_138.depth_ == 0) {
        uVar3 = 0x101;
        puVar1 = (ulong *)0x0;
      }
      else {
        uVar3 = local_138.max_depth_ << 0x20 | local_138.size_ & 0xff;
        puVar1 = (ulong *)local_138.buf_;
      }
      if ((uint)(uVar3 >> 0x21) == 2) {
        bVar2 = (byte)uVar3;
        if (bVar2 < 4) {
          if (bVar2 < 2) {
            uVar3 = (ulong)(byte)*puVar1;
          }
          else {
            uVar3 = (ulong)(ushort)*puVar1;
          }
        }
        else if (bVar2 < 8) {
          uVar3 = (ulong)(uint)*puVar1;
        }
        else {
          uVar3 = *puVar1;
        }
        pcVar5 = (char *)((long)puVar1 - uVar3);
      }
      TestEqStr(pcVar5,(char *)local_f8,"\'vec[0].AsKey()\' != \'test_data.c_str()\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                ,0xf7,"");
      if (local_138.depth_ == 0) {
        local_c0._8_8_ = 0x101;
        local_c0.data_ = (uint8_t *)0x0;
      }
      else {
        local_c0._8_8_ = (local_138.size_ & 0xff) + (local_138.max_depth_ << 0x20) + 0x100;
        local_c0.data_ = local_138.buf_;
      }
      flexbuffers::Reference::AsString(&local_d8,&local_c0);
      pcVar5 = "";
      TestEqStr((char *)local_d8.super_Sized.super_Object.data_,(char *)local_f8,
                "\'vec[0].AsString().c_str()\' != \'test_data.c_str()\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                ,0xfa,"");
      if (local_138.depth_ < 2) {
        uVar3 = 0x101;
        puVar1 = (ulong *)0x0;
      }
      else {
        puVar1 = (ulong *)((long)local_138.buf_ + (local_138.size_ & 0xff));
        uVar3 = local_138.max_depth_ << 0x20 | local_138.size_ & 0xff;
      }
      if ((uVar3 & 0xfffffffe00000000) == 0x400000000) {
        bVar2 = (byte)uVar3;
        if (bVar2 < 4) {
          if (bVar2 < 2) {
            uVar3 = (ulong)(byte)*puVar1;
          }
          else {
            uVar3 = (ulong)(ushort)*puVar1;
          }
        }
        else if (bVar2 < 8) {
          uVar3 = (ulong)(uint)*puVar1;
        }
        else {
          uVar3 = *puVar1;
        }
        pcVar5 = (char *)((long)puVar1 - uVar3);
      }
      TestEqStr(pcVar5,"hello","\'vec[1].AsKey()\' != \'\"hello\"\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                ,0xfc,"");
      if (local_138.depth_ < 2) {
        local_c0._8_8_ = 0x101;
        local_c0.data_ = (byte *)0x0;
      }
      else {
        local_c0.data_ = (uint8_t *)((long)local_138.buf_ + (local_138.size_ & 0xff));
        local_c0._8_8_ = (local_138.size_ & 0xff) + (local_138.max_depth_ << 0x20) + 0x100;
      }
      flexbuffers::Reference::AsString(&local_d8,&local_c0);
      TestEqStr((char *)local_d8.super_Sized.super_Object.data_,"hello",
                "\'vec[1].AsString().c_str()\' != \'\"hello\"\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                ,0xfd,"");
      if (local_f8 != local_e8) {
        operator_delete(local_f8,local_e8[0] + 1);
      }
      std::
      _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>,_std::_Identity<std::pair<unsigned_long,_unsigned_long>_>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~_Rb_tree(&local_b0.string_pool._M_t);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_b0.key_pool._M_t);
      if (local_b0.stack_.
          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.stack_.
                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.stack_.
                              super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.stack_.
                              super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((ulong *)local_b0.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (ulong *)0x0) {
        operator_delete(local_b0.buf_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b0.buf_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.buf_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  __assert_fail("finished_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x592,"void flexbuffers::Builder::Finished() const");
}

Assistant:

void FlexBuffersDeprecatedTest() {
  // FlexBuffers as originally designed had a flaw involving the
  // FBT_VECTOR_STRING datatype, and this test documents/tests the fix for it.
  // Discussion: https://github.com/google/flatbuffers/issues/5627
  flexbuffers::Builder slb;
  // FBT_VECTOR_* are "typed vectors" where all elements are of the same type.
  // Problem is, when storing FBT_STRING elements, it relies on that type to
  // get the bit-width for the size field of the string, which in this case
  // isn't present, and instead defaults to 8-bit. This means that any strings
  // stored inside such a vector, when accessed thru the old API that returns
  // a String reference, will appear to be truncated if the string stored is
  // actually >=256 bytes.
  std::string test_data(300, 'A');
  auto start = slb.StartVector();
  // This one will have a 16-bit size field.
  slb.String(test_data);
  // This one will have an 8-bit size field.
  slb.String("hello");
  // We're asking this to be serialized as a typed vector (true), but not
  // fixed size (false). The type will be FBT_VECTOR_STRING with a bit-width
  // of whatever the offsets in the vector need, the bit-widths of the strings
  // are not stored(!) <- the actual design flaw.
  // Note that even in the fixed code, we continue to serialize the elements of
  // FBT_VECTOR_STRING as FBT_STRING, since there may be old code out there
  // reading new data that we want to continue to function.
  // Thus, FBT_VECTOR_STRING, while deprecated, will always be represented the
  // same way, the fix lies on the reading side.
  slb.EndVector(start, true, false);
  slb.Finish();
  // Verify because why not.
  TEST_EQ(flexbuffers::VerifyBuffer(slb.GetBuffer().data(),
                                    slb.GetBuffer().size(), nullptr),
          true);
  // So now lets read this data back.
  // For existing data, since we have no way of knowing what the actual
  // bit-width of the size field of the string is, we are going to ignore this
  // field, and instead treat these strings as FBT_KEY (null-terminated), so we
  // can deal with strings of arbitrary length. This of course truncates strings
  // with embedded nulls, but we think that that is preferrable over truncating
  // strings >= 256 bytes.
  auto vec = flexbuffers::GetRoot(slb.GetBuffer()).AsTypedVector();
  // Even though this was serialized as FBT_VECTOR_STRING, it is read as
  // FBT_VECTOR_KEY:
  TEST_EQ(vec.ElementType(), flexbuffers::FBT_KEY);
  // Access the long string. Previously, this would return a string of size 1,
  // since it would read the high-byte of the 16-bit length.
  // This should now correctly test the full 300 bytes, using AsKey():
  TEST_EQ_STR(vec[0].AsKey(), test_data.c_str());
  // Old code that called AsString will continue to work, as the String
  // accessor objects now use a cached size that can come from a key as well.
  TEST_EQ_STR(vec[0].AsString().c_str(), test_data.c_str());
  // Short strings work as before:
  TEST_EQ_STR(vec[1].AsKey(), "hello");
  TEST_EQ_STR(vec[1].AsString().c_str(), "hello");
  // So, while existing code and data mostly "just work" with the fixes applied
  // to AsTypedVector and AsString, what do you do going forward?
  // Code accessing existing data doesn't necessarily need to change, though
  // you could consider using AsKey instead of AsString for a) documenting
  // that you are accessing keys, or b) a speedup if you don't actually use
  // the string size.
  // For new data, or data that doesn't need to be backwards compatible,
  // instead serialize as FBT_VECTOR (call EndVector with typed = false, then
  // read elements with AsString), or, for maximum compactness, use
  // FBT_VECTOR_KEY (call slb.Key above instead, read with AsKey or AsString).
}